

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.h
# Opt level: O1

Path<lemon::SmartDigraph> * __thiscall
lemon::
BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
::negativeCycle(Path<lemon::SmartDigraph> *__return_storage_ptr__,
               BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
               *this)

{
  Value *pVVar1;
  Digraph *pDVar2;
  iterator iVar3;
  pointer pAVar4;
  bool bVar5;
  int id_1;
  pointer pNVar6;
  Arc *pAVar7;
  int id;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint *puVar11;
  bool bVar12;
  long lVar13;
  ulong uVar14;
  NodeMap<int> state;
  Value_conflict1 local_64;
  VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_int>
  local_60;
  
  local_64 = -1;
  VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_int>::
  VectorMap(&local_60,&this->_gr->super_ExtendedSmartDigraphBase,&local_64);
  local_60.super_ObserverBase._vptr_ObserverBase = (_func_int **)&PTR__VectorMap_0016f5a0;
  (__return_storage_ptr__->tail).
  super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->tail).
  super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->head).
  super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->tail).
  super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->head).
  super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->head).
  super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pNVar6 = (this->_process).
           super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->_process).
                              super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar6) >> 2)) {
    uVar14 = 0;
    bVar12 = false;
    do {
      iVar8 = pNVar6[uVar14]._id;
      lVar13 = (long)iVar8;
      if (local_60.container.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar13] == -1) {
        pVVar1 = (this->_pred->
                 super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>_>
                 ).
                 super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
                 .super_Map.values;
        iVar9 = pVVar1[lVar13]._id;
        bVar5 = true;
        if (iVar9 != -1) {
          pAVar7 = pVVar1 + lVar13;
          uVar10 = (ulong)(uint)local_60.container.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar13];
          if (uVar14 != uVar10) {
            pDVar2 = this->_gr;
            puVar11 = (uint *)(local_60.container.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar13);
            do {
              if (-1 < (int)uVar10) goto LAB_00156fb5;
              *puVar11 = (uint)uVar14;
              iVar8 = (pDVar2->super_ExtendedSmartDigraphBase).super_SmartDigraphBase._arcs.
                      super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                      ._M_impl.super__Vector_impl_data._M_start[pAVar7->_id].source;
              lVar13 = (long)iVar8;
              iVar9 = pVVar1[lVar13]._id;
              if (iVar9 == -1) goto LAB_00156fb5;
              pAVar7 = pVVar1 + lVar13;
              puVar11 = (uint *)(local_60.container.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar13);
              uVar10 = (ulong)*puVar11;
            } while (uVar14 != uVar10);
          }
          iVar3._M_current =
               (__return_storage_ptr__->head).
               super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (__return_storage_ptr__->head).
              super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<lemon::SmartDigraphBase::Arc,std::allocator<lemon::SmartDigraphBase::Arc>>::
            _M_realloc_insert<lemon::SmartDigraphBase::Arc_const&>
                      ((vector<lemon::SmartDigraphBase::Arc,std::allocator<lemon::SmartDigraphBase::Arc>>
                        *)__return_storage_ptr__,iVar3,pAVar7);
          }
          else {
            (iVar3._M_current)->_id = iVar9;
            (__return_storage_ptr__->head).
            super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          bVar12 = true;
          for (iVar9 = (this->_gr->super_ExtendedSmartDigraphBase).super_SmartDigraphBase._arcs.
                       super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [(this->_pred->
                        super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>_>
                        ).
                        super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
                        .super_Map.values[lVar13]._id].source; iVar9 != iVar8;
              iVar9 = (this->_gr->super_ExtendedSmartDigraphBase).super_SmartDigraphBase._arcs.
                      super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [(this->_pred->
                       super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>_>
                       ).
                       super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
                       .super_Map.values[iVar9]._id].source) {
            pAVar7 = (this->_pred->
                     super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>_>
                     ).
                     super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
                     .super_Map.values + iVar9;
            iVar3._M_current =
                 (__return_storage_ptr__->head).
                 super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (__return_storage_ptr__->head).
                super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<lemon::SmartDigraphBase::Arc,std::allocator<lemon::SmartDigraphBase::Arc>>
              ::_M_realloc_insert<lemon::SmartDigraphBase::Arc_const&>
                        ((vector<lemon::SmartDigraphBase::Arc,std::allocator<lemon::SmartDigraphBase::Arc>>
                          *)__return_storage_ptr__,iVar3,pAVar7);
            }
            else {
              (iVar3._M_current)->_id = pAVar7->_id;
              (__return_storage_ptr__->head).
              super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
              ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
          }
          bVar5 = false;
        }
LAB_00156fb5:
        if (!bVar5) {
          if (!bVar12) {
            pAVar4 = (__return_storage_ptr__->tail).
                     super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (pAVar4 != (pointer)0x0) {
              operator_delete(pAVar4,(long)(__return_storage_ptr__->tail).
                                           super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pAVar4);
            }
            pAVar4 = (__return_storage_ptr__->head).
                     super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (pAVar4 != (pointer)0x0) {
              operator_delete(pAVar4,(long)(__return_storage_ptr__->head).
                                           super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pAVar4);
            }
          }
          break;
        }
      }
      uVar14 = uVar14 + 1;
      pNVar6 = (this->_process).
               super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while ((long)uVar14 <
             (long)(int)((ulong)((long)(this->_process).
                                       super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar6) >>
                        2));
  }
  local_60.super_ObserverBase._vptr_ObserverBase = (_func_int **)&PTR__VectorMap_0016f650;
  if (local_60.container.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.container.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.container.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.container.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
  ::ObserverBase::~ObserverBase(&local_60.super_ObserverBase);
  return __return_storage_ptr__;
}

Assistant:

lemon::Path<Digraph> negativeCycle() const {
    typename Digraph::template NodeMap<int> state(*_gr, -1);
    lemon::Path<Digraph>                    cycle;
    for (int i = 0; i < int(_process.size()); ++i) {
      if (state[_process[i]] != -1)
        continue;
      for (Node v = _process[i]; (*_pred)[v] != INVALID;
           v      = _gr->source((*_pred)[v])) {
        if (state[v] == i) {
          cycle.addFront((*_pred)[v]);
          for (Node u = _gr->source((*_pred)[v]); u != v;
               u      = _gr->source((*_pred)[u])) {
            cycle.addFront((*_pred)[u]);
          }
          return cycle;
        } else if (state[v] >= 0) {
          break;
        }
        state[v] = i;
      }
    }
    return cycle;
  }